

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCtxtPushInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr value)

{
  int iVar1;
  xmlParserInputPtr *ppxVar2;
  int newSize;
  xmlParserInputPtr *tmp;
  char *pcStack_28;
  int maxDepth;
  char *directory;
  xmlParserInputPtr value_local;
  xmlParserCtxtPtr ctxt_local;
  
  pcStack_28 = (char *)0x0;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (value == (xmlParserInputPtr)0x0)) {
    return -1;
  }
  iVar1 = 0x14;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar1 = 0x28;
  }
  if (ctxt->inputMax <= ctxt->inputNr) {
    iVar1 = xmlGrowCapacity(ctxt->inputMax,8,5,iVar1);
    if (iVar1 < 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum entity nesting depth exceeded");
      xmlHaltParser(ctxt);
      return -1;
    }
    ppxVar2 = (xmlParserInputPtr *)(*xmlRealloc)(ctxt->inputTab,(long)iVar1 << 3);
    if (ppxVar2 == (xmlParserInputPtr *)0x0) {
      xmlErrMemory(ctxt);
      return -1;
    }
    ctxt->inputTab = ppxVar2;
    ctxt->inputMax = iVar1;
  }
  if (((ctxt->inputNr == 0) && (value->filename != (char *)0x0)) &&
     (pcStack_28 = xmlParserGetDirectory(value->filename), pcStack_28 == (char *)0x0)) {
    xmlErrMemory(ctxt);
    ctxt_local._4_4_ = -1;
  }
  else if (ctxt->input_id < 0x7fffffff) {
    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;
    if (ctxt->inputNr == 0) {
      (*xmlFree)(ctxt->directory);
      ctxt->directory = pcStack_28;
    }
    iVar1 = ctxt->input_id;
    ctxt->input_id = iVar1 + 1;
    value->id = iVar1;
    ctxt_local._4_4_ = ctxt->inputNr;
    ctxt->inputNr = ctxt_local._4_4_ + 1;
  }
  else {
    xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Input ID overflow\n");
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCtxtPushInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr value)
{
    char *directory = NULL;
    int maxDepth;

    if ((ctxt == NULL) || (value == NULL))
        return(-1);

    maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;

    if (ctxt->inputNr >= ctxt->inputMax) {
        xmlParserInputPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->inputMax, sizeof(tmp[0]),
                                  5, maxDepth);
        if (newSize < 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                           "Maximum entity nesting depth exceeded");
            xmlHaltParser(ctxt);
            return(-1);
        }
        tmp = xmlRealloc(ctxt->inputTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        ctxt->inputTab = tmp;
        ctxt->inputMax = newSize;
    }

    if ((ctxt->inputNr == 0) && (value->filename != NULL)) {
        directory = xmlParserGetDirectory(value->filename);
        if (directory == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
    }

    if (ctxt->input_id >= INT_MAX) {
        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT, "Input ID overflow\n");
        return(-1);
    }

    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;

    if (ctxt->inputNr == 0) {
        xmlFree(ctxt->directory);
        ctxt->directory = directory;
    }

    /*
     * Internally, the input ID is only used to detect parameter entity
     * boundaries. But there are entity loaders in downstream code that
     * detect the main document by checking for "input_id == 1".
     */
    value->id = ctxt->input_id++;

    return(ctxt->inputNr++);
}